

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Maybe<kj::Own<capnp::ClientHook>_> __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::PromiseClient::writeTarget
          (PromiseClient *this,Builder target)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *pCVar4;
  long in_RSI;
  Maybe<kj::Own<capnp::ClientHook>_> MVar5;
  ClientHook local_28;
  _func_int **pp_Stack_20;
  
  *(undefined1 *)(in_RSI + 0x68) = 1;
  lVar1 = *(long *)(in_RSI + 0x20);
  plVar2 = *(long **)(in_RSI + 0x38);
  lVar3 = (**(code **)(*plVar2 + 0x28))(plVar2);
  if (lVar3 == lVar1) {
    (**(code **)(*plVar2 + 0x40))(this,plVar2);
    pCVar4 = extraout_RDX_00;
  }
  else {
    (**(code **)(*plVar2 + 0x20))(&local_28,plVar2);
    (this->super_RpcClient).super_ClientHook._vptr_ClientHook = local_28._vptr_ClientHook;
    (this->super_RpcClient).super_Refcounted.super_Disposer._vptr_Disposer = pp_Stack_20;
    pCVar4 = extraout_RDX;
  }
  MVar5.ptr.ptr = pCVar4;
  MVar5.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook>_>)MVar5.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> writeTarget(
        rpc::MessageTarget::Builder target) override {
      receivedCall = true;
      return connectionState->writeTarget(*cap, target);
    }